

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLiSample * __thiscall
pbrt::PortalImageInfiniteLight::SampleLi
          (PortalImageInfiniteLight *this,LightSampleContext ctx,Point2f u,SampledWavelengths lambda
          ,LightSamplingMode mode)

{
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar1;
  LightLiSample *in_RDI;
  float time;
  undefined1 in_ZMM0 [64];
  undefined1 auVar10 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  Point3f PVar14;
  Vector3f VVar15;
  Vector3<float> VVar16;
  Point3<float> PVar17;
  Bounds2f BVar18;
  SampledSpectrum SVar19;
  SampledSpectrum L;
  Float pdf;
  Vector3f wi;
  Float duv_dw;
  Point2f uv;
  Float mapPDF;
  Bounds2f b;
  PortalImageInfiniteLight *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  LightLiSample *this_00;
  LightHandle *light;
  LightLiSample *this_01;
  char (*in_stack_fffffffffffffed0) [12];
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  int line;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  Float *in_stack_fffffffffffffef0;
  LogLevel level;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  PortalImageInfiniteLight *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Point3f *in_stack_ffffffffffffff28;
  PortalImageInfiniteLight *in_stack_ffffffffffffff30;
  Float *in_stack_ffffffffffffff50;
  Bounds2f *in_stack_ffffffffffffff58;
  Point2f *in_stack_ffffffffffffff60;
  WindowedPiecewiseConstant2D *in_stack_ffffffffffffff68;
  float local_58;
  float local_4c;
  undefined1 extraout_var [56];
  undefined1 auVar13 [56];
  
  line = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  auVar13 = in_ZMM1._8_56_;
  auVar10 = in_ZMM0._8_56_;
  light = (LightHandle *)&stack0x00000038;
  this_01 = (LightLiSample *)&stack0x00000008;
  vmovlpd_avx(in_ZMM0._0_16_);
  this_00 = in_RDI;
  PVar14 = LightSampleContext::p
                     ((LightSampleContext *)
                      CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  auVar2._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2._8_56_ = auVar10;
  vmovlpd_avx(auVar2._0_16_);
  BVar18 = ImageBounds(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  auVar11._0_8_ = BVar18.pMax.super_Tuple2<pbrt::Point2,_float>;
  auVar11._8_56_ = auVar13;
  auVar3._0_8_ = BVar18.pMin.super_Tuple2<pbrt::Point2,_float>;
  auVar3._8_56_ = auVar10;
  vmovlpd_avx(auVar3._0_16_);
  vmovlpd_avx(auVar11._0_16_);
  auVar4._0_8_ = WindowedPiecewiseConstant2D::Sample
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  auVar4._8_56_ = extraout_var;
  vmovlpd_avx(auVar4._0_16_);
  auVar10 = (undefined1  [56])0x0;
  if ((local_4c != 0.0) || (NAN(local_4c))) {
    VVar15 = RenderFromImage(in_stack_ffffffffffffff00,
                             (Point2f *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                             in_stack_fffffffffffffef0);
    level = (LogLevel)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    auVar5._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar10;
    vmovlpd_avx(auVar5._0_16_);
    auVar10 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    if ((local_58 != 0.0) || (NAN(local_58))) {
      time = local_4c / local_58;
      auVar13 = (undefined1  [56])0x0;
      eVar1 = IsInf<float>(0.0);
      if (eVar1) {
        LogFatal<char_const(&)[12]>
                  (level,(char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),line,
                   (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   in_stack_fffffffffffffed0);
      }
      SVar19 = ImageLookup((PortalImageInfiniteLight *)
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           (Point2f *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (SampledWavelengths *)in_stack_ffffffffffffff00);
      auVar12._0_8_ = SVar19.values.values._8_8_;
      auVar12._8_56_ = auVar10;
      auVar6._0_8_ = SVar19.values.values._0_8_;
      auVar6._8_56_ = auVar13;
      vmovlpd_avx(auVar6._0_16_);
      vmovlpd_avx(auVar12._0_16_);
      LightHandle::TaggedPointer<pbrt::PortalImageInfiniteLight_const>
                ((LightHandle *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      auVar10 = (undefined1  [56])0x0;
      PVar14 = LightSampleContext::p((LightSampleContext *)CONCAT44(time,in_stack_fffffffffffffe90))
      ;
      auVar7._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar7._8_56_ = auVar10;
      vmovlpd_avx(auVar7._0_16_);
      auVar10 = (undefined1  [56])0x0;
      VVar16 = Tuple3<pbrt::Vector3,float>::operator*
                         ((Tuple3<pbrt::Vector3,_float> *)this_00,(float)((ulong)in_RDI >> 0x20));
      auVar8._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar10;
      vmovlpd_avx(auVar8._0_16_);
      PVar17 = Point3<float>::operator+((Point3<float> *)this_00,(Vector3<float> *)in_RDI);
      auVar9._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar9._8_56_ = auVar10;
      vmovlpd_avx(auVar9._0_16_);
      Interaction::Interaction
                ((Interaction *)this_00,(Point3f *)in_RDI,time,
                 (MediumInterface *)in_stack_fffffffffffffe88);
      LightLiSample::LightLiSample
                (this_01,light,&this_00->L,(Vector3f *)in_RDI,time,
                 (Interaction *)in_stack_fffffffffffffe88);
    }
    else {
      memset(in_RDI,0,0x78);
      LightLiSample::LightLiSample
                ((LightLiSample *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    }
  }
  else {
    memset(in_RDI,0,0x78);
    LightLiSample::LightLiSample
              ((LightLiSample *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  return this_00;
}

Assistant:

LightLiSample PortalImageInfiniteLight::SampleLi(LightSampleContext ctx, Point2f u,
                                                 SampledWavelengths lambda,
                                                 LightSamplingMode mode) const {
    Bounds2f b = ImageBounds(ctx.p());

    // Find $(u,v)$ sample coordinates in infinite light texture
    Float mapPDF;
    Point2f uv = distribution.Sample(u, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f wi = RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdf = mapPDF / duv_dw;
    CHECK(!IsInf(pdf));

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLiSample(
        this, L, wi, pdf,
        Interaction(ctx.p() + wi * (2 * sceneRadius), 0 /* time */, &mediumInterface));
}